

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_activate(pcap_t *p)

{
  int errnum;
  char *pcVar1;
  
  if (p->activated == 0) {
    errnum = (*p->activate_op)(p);
    if (errnum < 0) {
      if (p->errbuf[0] == '\0') {
        pcVar1 = pcap_statustostr(errnum);
        snprintf(p->errbuf,0x100,"%s",pcVar1);
      }
      p->read_op = pcap_not_initialized;
      p->inject_op = pcap_not_initialized;
      p->setfilter_op = pcap_not_initialized;
      p->setdirection_op = pcap_not_initialized;
      p->set_datalink_op = pcap_not_initialized;
      p->getnonblock_op = pcap_not_initialized;
      p->setnonblock_op = pcap_not_initialized;
      p->stats_op = pcap_not_initialized;
      p->cleanup_op = pcap_cleanup_live_common;
      p->oneshot_callback = pcap_oneshot;
    }
    else {
      p->activated = 1;
    }
  }
  else {
    builtin_strncpy(p->errbuf,"can\'t perform  operation on activated capture",0x2e);
    errnum = -4;
  }
  return errnum;
}

Assistant:

int
pcap_activate(pcap_t *p)
{
	int status;

	/*
	 * Catch attempts to re-activate an already-activated
	 * pcap_t; this should, for example, catch code that
	 * calls pcap_open_live() followed by pcap_activate(),
	 * as some code that showed up in a Stack Exchange
	 * question did.
	 */
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);
	status = p->activate_op(p);
	if (status >= 0)
		p->activated = 1;
	else {
		if (p->errbuf[0] == '\0') {
			/*
			 * No error message supplied by the activate routine;
			 * for the benefit of programs that don't specially
			 * handle errors other than PCAP_ERROR, return the
			 * error message corresponding to the status.
			 */
			pcap_snprintf(p->errbuf, PCAP_ERRBUF_SIZE, "%s",
			    pcap_statustostr(status));
		}

		/*
		 * Undo any operation pointer setting, etc. done by
		 * the activate operation.
		 */
		initialize_ops(p);
	}
	return (status);
}